

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

bool ghc::filesystem::exists(path *p,error_code *ec)

{
  file_status s;
  uint local_20 [2];
  
  status((filesystem *)local_20,p,ec);
  if (local_20[0] != 0) {
    std::error_code::clear(ec);
  }
  return 1 < local_20[0];
}

Assistant:

GHC_INLINE bool exists(const path& p, std::error_code& ec) noexcept
{
    file_status s = status(p, ec);
    if (status_known(s)) {
        ec.clear();
    }
    return exists(s);
}